

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

void gravity_class_blacken(gravity_vm *vm,gravity_class_t *c)

{
  uint32_t uVar1;
  ulong uVar2;
  long lVar3;
  gravity_value_t v;
  
  uVar1 = gravity_class_size(vm,c);
  gravity_vm_memupdate(vm,(ulong)uVar1);
  gravity_gray_object(vm,c->objclass);
  gravity_gray_object(vm,c->superclass);
  gravity_hash_iterate(c->htable,gravity_hash_gray,vm);
  if (c->nivars != 0) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      v.field_1.n = ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&c->ivars->isa + lVar3)
                    )->n;
      v.isa = *(gravity_class_t **)((long)c->ivars + lVar3 + -8);
      gravity_gray_value(vm,v);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < c->nivars);
  }
  return;
}

Assistant:

void gravity_class_blacken (gravity_vm *vm, gravity_class_t *c) {
    gravity_vm_memupdate(vm, gravity_class_size(vm, c));

    // metaclass
    gravity_gray_object(vm, (gravity_object_t *)c->objclass);

    // superclass
    gravity_gray_object(vm, (gravity_object_t *)c->superclass);

    // internals
    gravity_hash_iterate(c->htable, gravity_hash_gray, (void *)vm);

    // ivars
    for (uint32_t i=0; i<c->nivars; ++i) {
        gravity_gray_value(vm, c->ivars[i]);
    }
}